

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2yaml_Error.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::_obj2yaml_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int ev)

{
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  int local_1c;
  void *pvStack_18;
  int ev_local;
  _obj2yaml_error_category *this_local;
  
  local_1c = ev;
  pvStack_18 = this;
  this_local = (_obj2yaml_error_category *)__return_storage_ptr__;
  switch(ev) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Success",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"No such file.",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unrecognized file type.",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unsupported object file format.",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Feature not yet implemented.",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  default:
    llvm::llvm_unreachable_internal
              ("An enumerator of obj2yaml_error does not have a message defined.",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/obj2yaml_Error.cpp"
               ,0x2b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string _obj2yaml_error_category::message(int ev) const {
  switch (static_cast<obj2yaml_error>(ev)) {
  case obj2yaml_error::success:
    return "Success";
  case obj2yaml_error::file_not_found:
    return "No such file.";
  case obj2yaml_error::unrecognized_file_format:
    return "Unrecognized file type.";
  case obj2yaml_error::unsupported_obj_file_format:
    return "Unsupported object file format.";
  case obj2yaml_error::not_implemented:
    return "Feature not yet implemented.";
  }
  llvm_unreachable("An enumerator of obj2yaml_error does not have a message "
                   "defined.");
}